

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O0

void __thiscall
crnlib::vector<std::pair<crnlib::vec<6U,_float>,_unsigned_int>_>::clear
          (vector<std::pair<crnlib::vec<6U,_float>,_unsigned_int>_> *this)

{
  pair<crnlib::vec<6U,_float>,_unsigned_int> *in_RDI;
  uint in_stack_ffffffffffffffec;
  
  if (*(long *)(in_RDI->first).m_s != 0) {
    scalar_type<std::pair<crnlib::vec<6U,_float>,_unsigned_int>_>::destruct_array
              (in_RDI,in_stack_ffffffffffffffec);
    crnlib_free((void *)0x180b56);
    (in_RDI->first).m_s[0] = 0.0;
    (in_RDI->first).m_s[1] = 0.0;
    (in_RDI->first).m_s[2] = 0.0;
    (in_RDI->first).m_s[3] = 0.0;
  }
  return;
}

Assistant:

inline void clear() {
    if (m_p) {
      scalar_type<T>::destruct_array(m_p, m_size);
      crnlib_free(m_p);
      m_p = NULL;
      m_size = 0;
      m_capacity = 0;
    }
  }